

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O1

Vector2 __thiscall pm::Sampler::sampleUnitDisk(Sampler *this,unsigned_long *count,int *jump)

{
  uint uVar1;
  int iVar2;
  unsigned_long uVar3;
  Vector2 VVar4;
  uint32_t uVar5;
  ulong uVar6;
  int *in_RCX;
  
  if (*(ulong *)jump % (ulong)*(uint *)((long)count + 0xc) == 0) {
    uVar5 = Random::integer((Random *)(count + 0xf),0,(uint32_t)count[2]);
    *in_RCX = uVar5 * *(int *)((long)count + 0xc);
  }
  iVar2 = *in_RCX;
  uVar6 = *(ulong *)jump;
  *(ulong *)jump = uVar6 + 1;
  uVar6 = (ulong)(uint)(*(int *)((uVar6 % (ulong)*(uint *)((long)count + 0xc)) * 4 + count[0xc] +
                                (long)iVar2 * 4) + iVar2);
  uVar3 = count[6];
  *(undefined4 *)&this->_vptr_Sampler = *(undefined4 *)(uVar3 + uVar6 * 8);
  uVar1 = *(uint *)(uVar3 + 4 + uVar6 * 8);
  *(uint *)((long)&this->_vptr_Sampler + 4) = uVar1;
  VVar4.y = 0.0;
  VVar4.x = (float)uVar1;
  return VVar4;
}

Assistant:

Vector2 Sampler::sampleUnitDisk(unsigned long &count, int &jump)
{
	// Start of a new pixel
	if (count % numSamples_ == 0)
		jump = rnd_.integer(0, numSets_) * numSamples_;

	return diskSamples_[jump + shuffledIndices_[jump + count++ % numSamples_]];
}